

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_scanDecl(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  undefined1 uVar4;
  byte bVar5;
  
  if ((long)end - (long)ptr < 2) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 < 0xdc) {
    uVar4 = 7;
    if (bVar1 - 0xd8 < 4) goto LAB_0059096a;
    if (bVar1 == 0) {
      uVar4 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      goto LAB_0059096a;
    }
  }
  else {
    if (bVar1 - 0xdc < 4) {
      uVar4 = 8;
      goto LAB_0059096a;
    }
    if ((bVar1 == 0xff) && (0xfd < (byte)*ptr)) {
      uVar4 = 0;
      goto LAB_0059096a;
    }
  }
  uVar4 = 0x1d;
LAB_0059096a:
  switch(uVar4) {
  case 0x14:
    *nextTokPtr = ptr + 2;
    return 0x21;
  default:
switchD_0059098a_caseD_15:
    *nextTokPtr = ptr;
    return 0;
  case 0x16:
  case 0x18:
    ptr = ptr + 2;
    lVar3 = (long)end - (long)ptr;
    if (lVar3 < 2) {
      return -1;
    }
    break;
  case 0x1b:
    iVar2 = little2_scanComment(enc,ptr + 2,end,nextTokPtr);
    return iVar2;
  }
LAB_005909a5:
  bVar1 = ((byte *)ptr)[1];
  if (bVar1 < 0xdc) {
    bVar5 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        bVar5 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_005909fb:
        bVar5 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    bVar5 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_005909fb;
    bVar5 = 0;
  }
  switch(bVar5) {
  case 0x15:
    break;
  case 0x16:
  case 0x18:
    goto switchD_00590a13_caseD_16;
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    goto switchD_0059098a_caseD_15;
  case 0x1e:
    if (lVar3 < 4) {
      return -1;
    }
    bVar1 = ((byte *)ptr)[3];
    if (bVar1 < 0xdc) {
      bVar5 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar5 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[2]);
        }
        else {
LAB_00590aa3:
          bVar5 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar5 = 8;
    }
    else {
      if ((bVar1 != 0xff) || (((byte *)ptr)[2] < 0xfe)) goto LAB_00590aa3;
      bVar5 = 0;
    }
    if ((bVar5 < 0x1f) && ((0x40200600U >> (bVar5 & 0x1f) & 1) != 0))
    goto switchD_0059098a_caseD_15;
    break;
  default:
    if (1 < bVar5 - 9) goto switchD_0059098a_caseD_15;
  }
  *nextTokPtr = ptr;
  return 0x10;
switchD_00590a13_caseD_16:
  ptr = (char *)((byte *)ptr + 2);
  lVar3 = lVar3 + -2;
  if (lVar3 < 2) {
    return -1;
  }
  goto LAB_005909a5;
}

Assistant:

static int PTRCALL
PREFIX(scanDecl)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_MINUS:
    return PREFIX(scanComment)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COND_SECT_OPEN;
  case BT_NMSTRT:
  case BT_HEX:
    ptr += MINBPC(enc);
    break;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_PERCNT:
      REQUIRE_CHARS(enc, ptr, end, 2);
      /* don't allow <!ENTITY% foo "whatever"> */
      switch (BYTE_TYPE(enc, ptr + MINBPC(enc))) {
      case BT_S:
      case BT_CR:
      case BT_LF:
      case BT_PERCNT:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* fall through */
    case BT_S:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DECL_OPEN;
    case BT_NMSTRT:
    case BT_HEX:
      ptr += MINBPC(enc);
      break;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}